

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.h
# Opt level: O0

RWNode * __thiscall
dg::dda::MemorySSATransformation::SubgraphInfo::Summary::getUnknownPhi(Summary *this)

{
  bool bVar1;
  reference ppRVar2;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> S;
  RWNode *t;
  Offset local_68;
  Offset local_60;
  GenericDefSite<dg::dda::RWNode> local_58 [2];
  DefSite *in_stack_ffffffffffffffe0;
  DefinitionsMap<dg::dda::RWNode> *in_stack_ffffffffffffffe8;
  RWNode *local_8;
  
  t = (RWNode *)UNKNOWN_MEMORY;
  Offset::Offset(&local_60,0);
  Offset::Offset(&local_68,Offset::UNKNOWN);
  GenericDefSite<dg::dda::RWNode>::GenericDefSite(local_58,t,&local_60,&local_68);
  DefinitionsMap<dg::dda::RWNode>::get(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  bVar1 = std::
          set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
          empty((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                 *)0x17801c);
  if (bVar1) {
    local_8 = (RWNode *)0x0;
  }
  else {
    std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
    begin((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
           *)t);
    ppRVar2 = std::_Rb_tree_const_iterator<dg::dda::RWNode_*>::operator*
                        ((_Rb_tree_const_iterator<dg::dda::RWNode_*> *)0x178051);
    local_8 = *ppRVar2;
  }
  std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
  ~set((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *)
       0x17806e);
  return local_8;
}

Assistant:

RWNode *getUnknownPhi() {
                // FIXME: optimize this, we create std::set for nothing...
                auto S = inputs.get({UNKNOWN_MEMORY, 0, Offset::UNKNOWN});
                if (S.empty()) {
                    return nullptr;
                }
                assert(S.size() == 1);
                return *(S.begin());
            }